

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

Container *
Vector::factory(Registry *registry,
               list<const_Typelib::Type_*,_std::allocator<const_Typelib::Type_*>_> *on)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Type *on_00;
  char cVar2;
  int iVar3;
  Category CVar4;
  undefined8 uVar5;
  Vector *this;
  runtime_error *this_00;
  BadCategory *this_01;
  string full_name;
  string local_60;
  string local_40;
  
  if (*(long *)(on + 0x10) != 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"expected only one template argument for std::vector")
    ;
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  on_00 = *(Type **)(*(long *)on + 0x10);
  Typelib::Type::getName_abi_cxx11_();
  fullName(&local_40,&local_60);
  paVar1 = &local_60.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  cVar2 = Typelib::Registry::has((string *)registry,SUB81(&local_40,0));
  if (cVar2 == '\0') {
    this = (Vector *)operator_new(0xa0);
    Vector(this,on_00);
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"");
    Typelib::Registry::add((Type *)registry,(string *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
  }
  else {
    uVar5 = Typelib::Registry::get((string *)registry);
    iVar3 = Typelib::Type::getCategory();
    if (iVar3 != 7) {
      this_01 = (BadCategory *)__cxa_allocate_exception(0x18);
      CVar4 = Typelib::Type::getCategory();
      Typelib::BadCategory::BadCategory(this_01,CVar4,Container);
      __cxa_throw(this_01,&Typelib::BadCategory::typeinfo,std::runtime_error::~runtime_error);
    }
    this = (Vector *)__dynamic_cast(uVar5,&Typelib::Type::typeinfo,&Typelib::Container::typeinfo,0);
    if (this == (Vector *)0x0) {
      __cxa_bad_cast();
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return &this->super_Container;
}

Assistant:

Container const& Vector::factory(Registry& registry, std::list<Type const*> const& on)
{
    if (on.size() != 1)
        throw std::runtime_error("expected only one template argument for std::vector");

    Type const& contained_type = *on.front();
    std::string full_name = Vector::fullName(contained_type.getName());
    if (! registry.has(full_name))
    {
        Vector* new_type = new Vector(contained_type);
        registry.add(new_type);
        return *new_type;
    }

    const Type *type = registry.get(full_name);
    if (type->getCategory() != Type::Container) {
        throw BadCategory(type->getCategory(), Type::Container);
    } else {
        return dynamic_cast<Container const &>(*type);
    }
}